

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O3

int writewbmp(Wbmp *wbmp,_func_void_int_void_ptr *putout,void *out)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  iVar4 = 0;
  (*putout)(0,out);
  (*putout)(0,out);
  putmbi(wbmp->width,putout,out);
  putmbi(wbmp->height,putout,out);
  if (0 < wbmp->height) {
    do {
      iVar1 = wbmp->width;
      if (0 < iVar1) {
        iVar6 = 0;
        do {
          piVar3 = wbmp->bitmap + (long)(iVar4 * iVar1) + (long)iVar6;
          iVar2 = 7;
          uVar5 = 0;
          while( true ) {
            uVar5 = (uint)(*piVar3 == 1) << ((byte)iVar2 & 0x1f) | uVar5;
            bVar7 = iVar2 == 0;
            iVar2 = iVar2 + -1;
            if (bVar7) break;
            iVar6 = iVar6 + 1;
            piVar3 = piVar3 + 1;
            if (iVar1 <= iVar6) {
              if (iVar2 != 7) {
                (*putout)(uVar5,out);
              }
              goto LAB_00125a6f;
            }
          }
          (*putout)(uVar5,out);
          iVar1 = wbmp->width;
          iVar6 = iVar6 + 1;
        } while (iVar6 < iVar1);
      }
LAB_00125a6f:
      iVar4 = iVar4 + 1;
    } while (iVar4 < wbmp->height);
  }
  return 0;
}

Assistant:

int writewbmp(Wbmp *wbmp, void (*putout)(int c, void *out), void *out)
{
	int row, col;
	int bitpos, octet;

	/* Generate the header */
	putout(0, out); /* WBMP Type 0: B/W, Uncompressed bitmap */
	putout(0, out); /* FixHeaderField */

	/* Size of the image */
	putmbi(wbmp->width, putout, out);	/* width */
	putmbi(wbmp->height, putout, out);	/* height */


	/* Image data */
	for(row = 0; row < wbmp->height; row++) {
		bitpos = 8;
		octet = 0;

		for(col = 0; col < wbmp->width; col++) {
			octet |= ((wbmp->bitmap[row * wbmp->width + col] == 1) ? WBMP_WHITE : WBMP_BLACK) << --bitpos;
			if(bitpos == 0) {
				bitpos = 8;
				putout(octet, out);
				octet = 0;
			}
		}

		if(bitpos != 8) {
			putout(octet, out);
		}
	}

	return 0;
}